

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# markov-2.cpp
# Opt level: O2

int main(void)

{
  result_type_conflict1 rVar1;
  ostream *poVar2;
  pointer pdVar3;
  size_t sVar4;
  uint i_6;
  int iVar5;
  double *w_1;
  double *w;
  pointer pdVar6;
  long lVar7;
  bool bVar8;
  result_type_conflict rVar9;
  double dVar10;
  allocator_type local_1449;
  double local_1448;
  double local_1440;
  double local_1438;
  ulong uStack_1430;
  double local_1428;
  vector<double,_std::allocator<double>_> accum;
  vector<double,_std::allocator<double>_> weights;
  markov<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>
  mc;
  value_type local_13d0;
  uniform_real_distribution<double> local_13c8;
  engine_type eng;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"number of bins = ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"number of samples = ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::seed(&eng,0x72e3);
  local_13c8._M_param._M_a = 0.0;
  local_13c8._M_param._M_b = 1.0;
  std::vector<double,_std::allocator<double>_>::vector(&weights,2,(allocator_type *)&mc);
  pdVar3 = weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pdVar6 = weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start; pdVar6 != pdVar3; pdVar6 = pdVar6 + 1) {
    rVar9 = std::uniform_real_distribution<double>::operator()(&local_13c8,&eng);
    *pdVar6 = rVar9 * 0.001 + 1.0;
  }
  local_1440 = 0.0;
  for (pdVar3 = weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      pdVar3 != weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish; pdVar3 = pdVar3 + 1) {
    local_1440 = local_1440 + *pdVar3;
  }
  std::operator<<((ostream *)&std::cout,"[weights]\n");
  for (pdVar3 = weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      pdVar3 != weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish; pdVar3 = pdVar3 + 1) {
    poVar2 = std::ostream::_M_insert<double>(*pdVar3);
    std::operator<<(poVar2,' ');
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::operator<<((ostream *)&std::cout,"[Metropolis]\n");
  bcl::markov_impl<unsigned_long>::
  markov_impl<bcl::metropolis,std::vector<double,std::allocator<double>>>
            (&mc.super_markov_impl<unsigned_long>,(metropolis *)&accum,&weights);
  local_13d0 = 0.0;
  std::vector<double,_std::allocator<double>_>::vector(&accum,2,&local_13d0,&local_1449);
  sVar4 = 0;
  iVar5 = 10000000;
  while (bVar8 = iVar5 != 0, iVar5 = iVar5 + -1, bVar8) {
    rVar1 = bcl::detail::random_choice_walker<unsigned_long,unsigned_int,double,void>::operator()
                      ((random_choice_walker<unsigned_long,unsigned_int,double,void> *)
                       (mc.super_markov_impl<unsigned_long>.rc_.
                        super__Vector_base<bcl::random_choice<unsigned_long>,_std::allocator<bcl::random_choice<unsigned_long>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + (int)sVar4),&eng);
    sVar4 = (size_t)rVar1;
    accum.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[(int)rVar1] =
         accum.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
         _M_start[(int)rVar1] + 1.0;
  }
  std::operator<<((ostream *)&std::cout,"bin\tweight\t\tresult\t\tdiff\t\tsigma\t\tdiff/sigma\n");
  for (lVar7 = 0; lVar7 != 2; lVar7 = lVar7 + 1) {
    local_1438 = weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar7];
    uStack_1430 = 0;
    dVar10 = accum.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[lVar7];
    local_1428 = dVar10 / -10000000.0;
    if (dVar10 < 0.0) {
      dVar10 = sqrt(dVar10);
    }
    else {
      dVar10 = SQRT(dVar10);
    }
    local_1448 = dVar10 / 10000000.0;
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::operator<<(poVar2,"\t");
    poVar2 = std::ostream::_M_insert<double>
                       (weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar7] / local_1440);
    std::operator<<(poVar2,"    \t");
    poVar2 = std::ostream::_M_insert<double>
                       (accum.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar7] / 10000000.0);
    std::operator<<(poVar2,"    \t");
    local_1438 = ABS(local_1438 / local_1440 + local_1428);
    uStack_1430 = uStack_1430 & 0x7fffffffffffffff;
    poVar2 = std::ostream::_M_insert<double>(local_1438);
    std::operator<<(poVar2,"    \t");
    poVar2 = std::ostream::_M_insert<double>(local_1448);
    std::operator<<(poVar2,"    \t");
    poVar2 = std::ostream::_M_insert<double>(local_1438 / local_1448);
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&accum.super__Vector_base<double,_std::allocator<double>_>);
  std::
  vector<bcl::random_choice<unsigned_long>,_std::allocator<bcl::random_choice<unsigned_long>_>_>::
  ~vector(&mc.super_markov_impl<unsigned_long>.rc_);
  std::operator<<((ostream *)&std::cout,"[Metropolis (choose_next)]\n");
  accum.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&mc,2,(value_type *)&accum,
             (allocator_type *)&local_13d0);
  iVar5 = 10000000;
  while (bVar8 = iVar5 != 0, iVar5 = iVar5 + -1, bVar8) {
    sVar4 = bcl::metropolis::
            choose_next<std::vector<double,std::allocator<double>>,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                      (&weights,(long)(int)sVar4,&eng);
    *(double *)(mc.super_markov_impl<unsigned_long>.dim + (long)(int)sVar4 * 8) =
         *(double *)(mc.super_markov_impl<unsigned_long>.dim + (long)(int)sVar4 * 8) + 1.0;
  }
  std::operator<<((ostream *)&std::cout,"bin\tweight\t\tresult\t\tdiff\t\tsigma\t\tdiff/sigma\n");
  for (lVar7 = 0; lVar7 != 2; lVar7 = lVar7 + 1) {
    local_1438 = weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar7];
    uStack_1430 = 0;
    dVar10 = *(double *)(mc.super_markov_impl<unsigned_long>.dim + lVar7 * 8);
    local_1428 = dVar10 / -10000000.0;
    if (dVar10 < 0.0) {
      dVar10 = sqrt(dVar10);
    }
    else {
      dVar10 = SQRT(dVar10);
    }
    local_1448 = dVar10 / 10000000.0;
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::operator<<(poVar2,"\t");
    poVar2 = std::ostream::_M_insert<double>
                       (weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar7] / local_1440);
    std::operator<<(poVar2,"    \t");
    poVar2 = std::ostream::_M_insert<double>
                       (*(double *)(mc.super_markov_impl<unsigned_long>.dim + lVar7 * 8) /
                        10000000.0);
    std::operator<<(poVar2,"    \t");
    local_1438 = ABS(local_1438 / local_1440 + local_1428);
    uStack_1430 = uStack_1430 & 0x7fffffffffffffff;
    poVar2 = std::ostream::_M_insert<double>(local_1438);
    std::operator<<(poVar2,"    \t");
    poVar2 = std::ostream::_M_insert<double>(local_1448);
    std::operator<<(poVar2,"    \t");
    poVar2 = std::ostream::_M_insert<double>(local_1438 / local_1448);
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)&mc);
  std::operator<<((ostream *)&std::cout,"[heat bath]\n");
  bcl::markov_impl<unsigned_long>::
  markov_impl<bcl::heatbath,std::vector<double,std::allocator<double>>>
            (&mc.super_markov_impl<unsigned_long>,(heatbath *)&accum,&weights);
  local_13d0 = 0.0;
  std::vector<double,_std::allocator<double>_>::vector(&accum,2,&local_13d0,&local_1449);
  iVar5 = 10000000;
  while (bVar8 = iVar5 != 0, iVar5 = iVar5 + -1, bVar8) {
    rVar1 = bcl::detail::random_choice_walker<unsigned_long,unsigned_int,double,void>::operator()
                      ((random_choice_walker<unsigned_long,unsigned_int,double,void> *)
                       (mc.super_markov_impl<unsigned_long>.rc_.
                        super__Vector_base<bcl::random_choice<unsigned_long>,_std::allocator<bcl::random_choice<unsigned_long>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + (int)sVar4),&eng);
    sVar4 = (size_t)rVar1;
    accum.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[(int)rVar1] =
         accum.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
         _M_start[(int)rVar1] + 1.0;
  }
  std::operator<<((ostream *)&std::cout,"bin\tweight\t\tresult\t\tdiff\t\tsigma\t\tdiff/sigma\n");
  for (lVar7 = 0; lVar7 != 2; lVar7 = lVar7 + 1) {
    local_1438 = weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar7];
    uStack_1430 = 0;
    dVar10 = accum.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[lVar7];
    local_1428 = dVar10 / -10000000.0;
    if (dVar10 < 0.0) {
      dVar10 = sqrt(dVar10);
    }
    else {
      dVar10 = SQRT(dVar10);
    }
    local_1448 = dVar10 / 10000000.0;
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::operator<<(poVar2,"\t");
    poVar2 = std::ostream::_M_insert<double>
                       (weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar7] / local_1440);
    std::operator<<(poVar2,"    \t");
    poVar2 = std::ostream::_M_insert<double>
                       (accum.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar7] / 10000000.0);
    std::operator<<(poVar2,"    \t");
    local_1438 = ABS(local_1438 / local_1440 + local_1428);
    uStack_1430 = uStack_1430 & 0x7fffffffffffffff;
    poVar2 = std::ostream::_M_insert<double>(local_1438);
    std::operator<<(poVar2,"    \t");
    poVar2 = std::ostream::_M_insert<double>(local_1448);
    std::operator<<(poVar2,"    \t");
    poVar2 = std::ostream::_M_insert<double>(local_1438 / local_1448);
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&accum.super__Vector_base<double,_std::allocator<double>_>);
  std::
  vector<bcl::random_choice<unsigned_long>,_std::allocator<bcl::random_choice<unsigned_long>_>_>::
  ~vector(&mc.super_markov_impl<unsigned_long>.rc_);
  std::operator<<((ostream *)&std::cout,"[heat bath (choose_next)]\n");
  accum.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&mc,2,(value_type *)&accum,
             (allocator_type *)&local_13d0);
  iVar5 = 10000000;
  while (bVar8 = iVar5 != 0, iVar5 = iVar5 + -1, bVar8) {
    sVar4 = bcl::heatbath::
            choose_next<std::vector<double,std::allocator<double>>,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                      (&weights,(int)sVar4,&eng);
    *(double *)(mc.super_markov_impl<unsigned_long>.dim + (long)(int)sVar4 * 8) =
         *(double *)(mc.super_markov_impl<unsigned_long>.dim + (long)(int)sVar4 * 8) + 1.0;
  }
  std::operator<<((ostream *)&std::cout,"bin\tweight\t\tresult\t\tdiff\t\tsigma\t\tdiff/sigma\n");
  for (lVar7 = 0; lVar7 != 2; lVar7 = lVar7 + 1) {
    local_1438 = weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar7];
    uStack_1430 = 0;
    dVar10 = *(double *)(mc.super_markov_impl<unsigned_long>.dim + lVar7 * 8);
    local_1428 = dVar10 / -10000000.0;
    if (dVar10 < 0.0) {
      dVar10 = sqrt(dVar10);
    }
    else {
      dVar10 = SQRT(dVar10);
    }
    local_1448 = dVar10 / 10000000.0;
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::operator<<(poVar2,"\t");
    poVar2 = std::ostream::_M_insert<double>
                       (weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar7] / local_1440);
    std::operator<<(poVar2,"    \t");
    poVar2 = std::ostream::_M_insert<double>
                       (*(double *)(mc.super_markov_impl<unsigned_long>.dim + lVar7 * 8) /
                        10000000.0);
    std::operator<<(poVar2,"    \t");
    local_1438 = ABS(local_1438 / local_1440 + local_1428);
    uStack_1430 = uStack_1430 & 0x7fffffffffffffff;
    poVar2 = std::ostream::_M_insert<double>(local_1438);
    std::operator<<(poVar2,"    \t");
    poVar2 = std::ostream::_M_insert<double>(local_1448);
    std::operator<<(poVar2,"    \t");
    poVar2 = std::ostream::_M_insert<double>(local_1438 / local_1448);
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)&mc);
  std::operator<<((ostream *)&std::cout,"[Suwa-Todo 2010]\n");
  bcl::markov_impl<unsigned_long>::
  markov_impl<bcl::st2010,std::vector<double,std::allocator<double>>>
            (&mc.super_markov_impl<unsigned_long>,(st2010 *)&accum,&weights);
  local_13d0 = 0.0;
  std::vector<double,_std::allocator<double>_>::vector(&accum,2,&local_13d0,&local_1449);
  iVar5 = 10000000;
  while (bVar8 = iVar5 != 0, iVar5 = iVar5 + -1, bVar8) {
    rVar1 = bcl::detail::random_choice_walker<unsigned_long,unsigned_int,double,void>::operator()
                      ((random_choice_walker<unsigned_long,unsigned_int,double,void> *)
                       (mc.super_markov_impl<unsigned_long>.rc_.
                        super__Vector_base<bcl::random_choice<unsigned_long>,_std::allocator<bcl::random_choice<unsigned_long>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + (int)sVar4),&eng);
    sVar4 = (size_t)rVar1;
    accum.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[(int)rVar1] =
         accum.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
         _M_start[(int)rVar1] + 1.0;
  }
  std::operator<<((ostream *)&std::cout,"bin\tweight\t\tresult\t\tdiff\t\tsigma\t\tdiff/sigma\n");
  for (lVar7 = 0; lVar7 != 2; lVar7 = lVar7 + 1) {
    local_1438 = weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar7];
    uStack_1430 = 0;
    dVar10 = accum.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[lVar7];
    local_1428 = dVar10 / -10000000.0;
    if (dVar10 < 0.0) {
      dVar10 = sqrt(dVar10);
    }
    else {
      dVar10 = SQRT(dVar10);
    }
    local_1448 = dVar10 / 10000000.0;
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::operator<<(poVar2,"\t");
    poVar2 = std::ostream::_M_insert<double>
                       (weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar7] / local_1440);
    std::operator<<(poVar2,"    \t");
    poVar2 = std::ostream::_M_insert<double>
                       (accum.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar7] / 10000000.0);
    std::operator<<(poVar2,"    \t");
    local_1438 = ABS(local_1438 / local_1440 + local_1428);
    uStack_1430 = uStack_1430 & 0x7fffffffffffffff;
    poVar2 = std::ostream::_M_insert<double>(local_1438);
    std::operator<<(poVar2,"    \t");
    poVar2 = std::ostream::_M_insert<double>(local_1448);
    std::operator<<(poVar2,"    \t");
    poVar2 = std::ostream::_M_insert<double>(local_1438 / local_1448);
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&accum.super__Vector_base<double,_std::allocator<double>_>);
  std::
  vector<bcl::random_choice<unsigned_long>,_std::allocator<bcl::random_choice<unsigned_long>_>_>::
  ~vector(&mc.super_markov_impl<unsigned_long>.rc_);
  std::operator<<((ostream *)&std::cout,"[Suwa-Todo 2010 (choose_next)]\n");
  accum.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&mc,2,(value_type *)&accum,
             (allocator_type *)&local_13d0);
  iVar5 = 10000000;
  while (bVar8 = iVar5 != 0, iVar5 = iVar5 + -1, bVar8) {
    sVar4 = bcl::st2010::
            choose_next<std::vector<double,std::allocator<double>>,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                      (&weights,(long)(int)sVar4,&eng);
    *(double *)(mc.super_markov_impl<unsigned_long>.dim + (long)(int)sVar4 * 8) =
         *(double *)(mc.super_markov_impl<unsigned_long>.dim + (long)(int)sVar4 * 8) + 1.0;
  }
  std::operator<<((ostream *)&std::cout,"bin\tweight\t\tresult\t\tdiff\t\tsigma\t\tdiff/sigma\n");
  for (lVar7 = 0; lVar7 != 2; lVar7 = lVar7 + 1) {
    local_1438 = weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar7];
    uStack_1430 = 0;
    dVar10 = *(double *)(mc.super_markov_impl<unsigned_long>.dim + lVar7 * 8);
    local_1428 = dVar10 / -10000000.0;
    if (dVar10 < 0.0) {
      dVar10 = sqrt(dVar10);
    }
    else {
      dVar10 = SQRT(dVar10);
    }
    local_1448 = dVar10 / 10000000.0;
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::operator<<(poVar2,"\t");
    poVar2 = std::ostream::_M_insert<double>
                       (weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar7] / local_1440);
    std::operator<<(poVar2,"    \t");
    poVar2 = std::ostream::_M_insert<double>
                       (*(double *)(mc.super_markov_impl<unsigned_long>.dim + lVar7 * 8) /
                        10000000.0);
    std::operator<<(poVar2,"    \t");
    local_1438 = ABS(local_1438 / local_1440 + local_1428);
    uStack_1430 = uStack_1430 & 0x7fffffffffffffff;
    poVar2 = std::ostream::_M_insert<double>(local_1438);
    std::operator<<(poVar2,"    \t");
    poVar2 = std::ostream::_M_insert<double>(local_1448);
    std::operator<<(poVar2,"    \t");
    poVar2 = std::ostream::_M_insert<double>(local_1438 / local_1448);
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)&mc);
  std::operator<<((ostream *)&std::cout,"[Suwa-Todo 2013]\n");
  bcl::markov_impl<unsigned_long>::
  markov_impl<bcl::st2013,std::vector<double,std::allocator<double>>>
            (&mc.super_markov_impl<unsigned_long>,(st2013 *)&accum,&weights);
  local_13d0 = 0.0;
  std::vector<double,_std::allocator<double>_>::vector(&accum,2,&local_13d0,&local_1449);
  iVar5 = 10000000;
  while (bVar8 = iVar5 != 0, iVar5 = iVar5 + -1, bVar8) {
    rVar1 = bcl::detail::random_choice_walker<unsigned_long,unsigned_int,double,void>::operator()
                      ((random_choice_walker<unsigned_long,unsigned_int,double,void> *)
                       (mc.super_markov_impl<unsigned_long>.rc_.
                        super__Vector_base<bcl::random_choice<unsigned_long>,_std::allocator<bcl::random_choice<unsigned_long>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + (int)sVar4),&eng);
    sVar4 = (size_t)rVar1;
    accum.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[(int)rVar1] =
         accum.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
         _M_start[(int)rVar1] + 1.0;
  }
  std::operator<<((ostream *)&std::cout,"bin\tweight\t\tresult\t\tdiff\t\tsigma\t\tdiff/sigma\n");
  for (lVar7 = 0; lVar7 != 2; lVar7 = lVar7 + 1) {
    local_1438 = weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar7];
    uStack_1430 = 0;
    dVar10 = accum.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[lVar7];
    local_1428 = dVar10 / -10000000.0;
    if (dVar10 < 0.0) {
      dVar10 = sqrt(dVar10);
    }
    else {
      dVar10 = SQRT(dVar10);
    }
    local_1448 = dVar10 / 10000000.0;
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::operator<<(poVar2,"\t");
    poVar2 = std::ostream::_M_insert<double>
                       (weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar7] / local_1440);
    std::operator<<(poVar2,"    \t");
    poVar2 = std::ostream::_M_insert<double>
                       (accum.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar7] / 10000000.0);
    std::operator<<(poVar2,"    \t");
    local_1438 = ABS(local_1438 / local_1440 + local_1428);
    uStack_1430 = uStack_1430 & 0x7fffffffffffffff;
    poVar2 = std::ostream::_M_insert<double>(local_1438);
    std::operator<<(poVar2,"    \t");
    poVar2 = std::ostream::_M_insert<double>(local_1448);
    std::operator<<(poVar2,"    \t");
    poVar2 = std::ostream::_M_insert<double>(local_1438 / local_1448);
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&accum.super__Vector_base<double,_std::allocator<double>_>);
  std::
  vector<bcl::random_choice<unsigned_long>,_std::allocator<bcl::random_choice<unsigned_long>_>_>::
  ~vector(&mc.super_markov_impl<unsigned_long>.rc_);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&weights.super__Vector_base<double,_std::allocator<double>_>);
  return 0;
}

Assistant:

int main() {
try {
  std::cout << "number of bins = " << n << std::endl;
  std::cout << "number of samples = " << samples << std::endl;

  // random number generator
  typedef std::mt19937 engine_type;
  engine_type eng(29411);
  std::uniform_real_distribution<> dist;

  // generate weights
  std::vector<double> weights(n);
  for (auto& w : weights) w = 1.0 + 0.001 * dist(eng);
  double total = std::accumulate(weights.begin(), weights.end(), 0.0);
  std::cout << "[weights]\n";
  for (auto& w : weights) std::cout << w << ' ';
  std::cout << std::endl;

  // generate markov chain
  int x = 0;
  {
    std::cout << "[Metropolis]\n";
    bcl::markov<engine_type> mc(bcl::metropolis(), weights);
    std::vector<double> accum(n, 0);
    for (unsigned int t = 0; t < samples; ++t) ++accum[x = mc(x, eng)];
    std::cout << "bin\tweight\t\tresult\t\tdiff\t\tsigma\t\tdiff/sigma\n";
    for (unsigned int i = 0; i < n; ++i) {
      double diff = std::abs((weights[i] / total) - (accum[i] / samples));
      double sigma = std::sqrt(accum[i]) / samples;
      std::cout << i << "\t" << (weights[i] / total) << "    \t"
                << (accum[i] / samples) << "    \t" << diff << "    \t"
                << sigma << "    \t" << (diff / sigma) << std::endl;
    }
  }
  {
    std::cout << "[Metropolis (choose_next)]\n";
    std::vector<double> accum(n, 0);
    for (unsigned int t = 0; t < samples; ++t)
      ++accum[x = bcl::metropolis::choose_next(weights, x, eng)];
    std::cout << "bin\tweight\t\tresult\t\tdiff\t\tsigma\t\tdiff/sigma\n";
    for (unsigned int i = 0; i < n; ++i) {
      double diff = std::abs((weights[i] / total) - (accum[i] / samples));
      double sigma = std::sqrt(accum[i]) / samples;
      std::cout << i << "\t" << (weights[i] / total) << "    \t"
                << (accum[i] / samples) << "    \t" << diff << "    \t"
                << sigma << "    \t" << (diff / sigma) << std::endl;
    }
  }
  {
    std::cout << "[heat bath]\n";
    bcl::markov<engine_type> mc(bcl::heatbath(), weights);
    std::vector<double> accum(n, 0);
    for (unsigned int t = 0; t < samples; ++t) ++accum[x = mc(x, eng)];
    std::cout << "bin\tweight\t\tresult\t\tdiff\t\tsigma\t\tdiff/sigma\n";
    for (unsigned int i = 0; i < n; ++i) {
      double diff = std::abs((weights[i] / total) - (accum[i] / samples));
      double sigma = std::sqrt(accum[i]) / samples;
      std::cout << i << "\t" << (weights[i] / total) << "    \t"
                << (accum[i] / samples) << "    \t" << diff << "    \t"
                << sigma << "    \t" << (diff / sigma) << std::endl;
    }
  }
  {
    std::cout << "[heat bath (choose_next)]\n";
    std::vector<double> accum(n, 0);
    for (unsigned int t = 0; t < samples; ++t)
      ++accum[x = bcl::heatbath::choose_next(weights, x, eng)];
    std::cout << "bin\tweight\t\tresult\t\tdiff\t\tsigma\t\tdiff/sigma\n";
    for (unsigned int i = 0; i < n; ++i) {
      double diff = std::abs((weights[i] / total) - (accum[i] / samples));
      double sigma = std::sqrt(accum[i]) / samples;
      std::cout << i << "\t" << (weights[i] / total) << "    \t"
                << (accum[i] / samples) << "    \t" << diff << "    \t"
                << sigma << "    \t" << (diff / sigma) << std::endl;
    }
  }
  {
    std::cout << "[Suwa-Todo 2010]\n";
    bcl::markov<engine_type> mc(bcl::st2010(), weights);
    std::vector<double> accum(n, 0);
    for (unsigned int t = 0; t < samples; ++t) ++accum[x = mc(x, eng)];
    std::cout << "bin\tweight\t\tresult\t\tdiff\t\tsigma\t\tdiff/sigma\n";
    for (unsigned int i = 0; i < n; ++i) {
      double diff = std::abs((weights[i] / total) - (accum[i] / samples));
      double sigma = std::sqrt(accum[i]) / samples;
      std::cout << i << "\t" << (weights[i] / total) << "    \t"
                << (accum[i] / samples) << "    \t" << diff << "    \t"
                << sigma << "    \t" << (diff / sigma) << std::endl;
    }
  }
  {
    std::cout << "[Suwa-Todo 2010 (choose_next)]\n";
    std::vector<double> accum(n, 0);
    for (unsigned int t = 0; t < samples; ++t)
      ++accum[x = bcl::st2010::choose_next(weights, x, eng)];
    std::cout << "bin\tweight\t\tresult\t\tdiff\t\tsigma\t\tdiff/sigma\n";
    for (unsigned int i = 0; i < n; ++i) {
      double diff = std::abs((weights[i] / total) - (accum[i] / samples));
      double sigma = std::sqrt(accum[i]) / samples;
      std::cout << i << "\t" << (weights[i] / total) << "    \t"
                << (accum[i] / samples) << "    \t" << diff << "    \t"
                << sigma << "    \t" << (diff / sigma) << std::endl;
    }
  }
  {
    std::cout << "[Suwa-Todo 2013]\n";
    bcl::markov<engine_type> mc(bcl::st2013(), weights);
    std::vector<double> accum(n, 0);
    for (unsigned int t = 0; t < samples; ++t) ++accum[x = mc(x, eng)];
    std::cout << "bin\tweight\t\tresult\t\tdiff\t\tsigma\t\tdiff/sigma\n";
    for (unsigned int i = 0; i < n; ++i) {
      double diff = std::abs((weights[i] / total) - (accum[i] / samples));
      double sigma = std::sqrt(accum[i]) / samples;
      std::cout << i << "\t" << (weights[i] / total) << "    \t"
                << (accum[i] / samples) << "    \t" << diff << "    \t"
                << sigma << "    \t" << (diff / sigma) << std::endl;
    }
  }
}
catch (const std::exception& excp) {
  std::cerr << excp.what() << std::endl;
  std::exit(-1); }
catch (...) {
  std::cerr << "Unknown exception occurred!" << std::endl;
  std::exit(-1); }
}